

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall Network::update(Network *this)

{
  bool bVar1;
  reference ppPVar2;
  reference ppSVar3;
  __normal_iterator<Population_**,_std::vector<Population_*,_std::allocator<Population_*>_>_>
  *in_RDI;
  Synapse *s;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Synapse_*,_std::allocator<Synapse_*>_> *__range1_1;
  Population *p;
  iterator __end1;
  iterator __begin1;
  vector<Population_*,_std::allocator<Population_*>_> *__range1;
  vector<Population_*,_std::allocator<Population_*>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<Synapse_**,_std::vector<Synapse_*,_std::allocator<Synapse_*>_>_> local_38 [2];
  Population *local_28;
  Population **local_20;
  __normal_iterator<Population_**,_std::vector<Population_*,_std::allocator<Population_*>_>_>
  local_18;
  __normal_iterator<Population_**,_std::vector<Population_*,_std::allocator<Population_*>_>_>
  *local_10;
  
  local_10 = in_RDI + 4;
  local_18._M_current =
       (Population **)
       std::vector<Population_*,_std::allocator<Population_*>_>::begin(in_stack_ffffffffffffffa8);
  local_20 = (Population **)
             std::vector<Population_*,_std::allocator<Population_*>_>::end
                       (in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<Population_**,_std::vector<Population_*,_std::allocator<Population_*>_>_>
                               *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<Population_**,_std::vector<Population_*,_std::allocator<Population_*>_>_>
              ::operator*(&local_18);
    local_28 = *ppPVar2;
    (**local_28->_vptr_Population)();
    __gnu_cxx::
    __normal_iterator<Population_**,_std::vector<Population_*,_std::allocator<Population_*>_>_>::
    operator++(&local_18);
  }
  local_38[0]._M_current =
       (Synapse **)
       std::vector<Synapse_*,_std::allocator<Synapse_*>_>::begin
                 ((vector<Synapse_*,_std::allocator<Synapse_*>_> *)in_stack_ffffffffffffffa8);
  std::vector<Synapse_*,_std::allocator<Synapse_*>_>::end
            ((vector<Synapse_*,_std::allocator<Synapse_*>_> *)in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Synapse_**,_std::vector<Synapse_*,_std::allocator<Synapse_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<Synapse_**,_std::vector<Synapse_*,_std::allocator<Synapse_*>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    ppSVar3 = __gnu_cxx::
              __normal_iterator<Synapse_**,_std::vector<Synapse_*,_std::allocator<Synapse_*>_>_>::
              operator*(local_38);
    (**(*ppSVar3)->_vptr_Synapse)();
    __gnu_cxx::__normal_iterator<Synapse_**,_std::vector<Synapse_*,_std::allocator<Synapse_*>_>_>::
    operator++(local_38);
  }
  return;
}

Assistant:

void Network::update() {
    for(Population* p : populations) {
        p->update();
    }
    for(Synapse* s : synapses) {
        s->update();
    }
}